

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

int mm_validate_table_fsize(uint8_t table_id,FILE *stream,unsigned_long expected_size)

{
  unsigned_long uVar1;
  char *pcVar2;
  size_t actual_size;
  unsigned_long expected_size_local;
  FILE *stream_local;
  uint8_t table_id_local;
  
  fseek((FILE *)stream,0,2);
  uVar1 = ftell((FILE *)stream);
  fseek((FILE *)stream,0,0);
  if (uVar1 == expected_size) {
    stream_local._4_4_ = 0;
  }
  else {
    pcVar2 = table_to_string(table_id);
    printf("Incorrect length for %s table, expected: %lu bytes, actual: %zd bytes.\n",pcVar2,
           expected_size,uVar1);
    stream_local._4_4_ = -1;
  }
  return stream_local._4_4_;
}

Assistant:

int mm_validate_table_fsize(uint8_t table_id, FILE *stream, unsigned long expected_size)
{
    size_t actual_size;
    fseek(stream, 0, SEEK_END);
    actual_size = ftell(stream);
    fseek(stream, 0, SEEK_SET);

    if (actual_size != (expected_size)) {
        printf("Incorrect length for %s table, expected: %lu bytes, actual: %zd bytes.\n",
            table_to_string(table_id),
            expected_size,
            actual_size);
        return (-1);
    }

    return (0);
}